

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestingUtility.cpp
# Opt level: O2

FP3 * __thiscall BaseFixture::urandFP3(FP3 *__return_storage_ptr__,BaseFixture *this,FP3 a,FP3 b)

{
  BaseFixture *this_00;
  FP FVar1;
  
  this_00 = (BaseFixture *)__return_storage_ptr__;
  FVar1 = urand((BaseFixture *)__return_storage_ptr__,a.x,b.x);
  __return_storage_ptr__->x = FVar1;
  FVar1 = urand(this_00,a.y,b.y);
  __return_storage_ptr__->y = FVar1;
  FVar1 = urand(this_00,a.z,b.z);
  __return_storage_ptr__->z = FVar1;
  return __return_storage_ptr__;
}

Assistant:

FP3 BaseFixture::urandFP3(FP3 a, FP3 b) {
    FP3 result;
    result.x = urand(a.x, b.x);
    result.y = urand(a.y, b.y);
    result.z = urand(a.z, b.z);
    return result;
}